

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O3

int cpu_exec_arm(uc_struct_conflict1 *uc,CPUState *cpu)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUARMState *env;
  TranslationBlock *pTVar4;
  long lVar5;
  undefined8 uVar6;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var7;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var8;
  CPUClass *pCVar9;
  CPUWatchpoint *pCVar10;
  _Bool _Var11;
  char cVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  TranslationBlock *pTVar18;
  byte bVar19;
  TranslationBlock_conflict *pTVar20;
  TranslationBlock_conflict *pTVar21;
  uint cf_mask;
  TranslationBlock_conflict *pTVar22;
  CPUClass *pCVar23;
  list_item *plVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  uint32_t flags;
  target_ulong cs_base;
  uint32_t local_6c;
  uint local_68;
  uint local_64;
  CPUClass *local_60;
  uc_struct_conflict1 *local_58;
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar23 = cpu->cc;
  local_58 = uc;
  if (cpu->halted != 0) {
    if (pCVar23->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var11 = (*pCVar23->has_work)((CPUState_conflict *)cpu);
    if (!_Var11) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar23->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar13 = __sigsetjmp(local_58->exits + (long)local_58->nested_level * 0x19 + 0x33,0);
  local_60 = pCVar23;
  if (iVar13 != 0) {
    local_60 = cpu->cc;
  }
LAB_0056f0c2:
  puVar2 = cpu->uc;
  uVar15 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var11 = (*puVar2->stop_interrupt)(puVar2,uVar15);
    if (_Var11) {
      plVar24 = puVar2->hook[0xe].head;
      goto joined_r0x0056f77a;
    }
    uVar15 = cpu->exception_index;
  }
  pCVar23 = local_60;
  if (-1 < (int)uVar15) {
    if (0xffff < uVar15) {
      if (uVar15 == 0x10002) {
        pCVar9 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          for (pCVar10 = (cpu->watchpoints).tqh_first; pCVar10 != (CPUWatchpoint *)0x0;
              pCVar10 = (pCVar10->entry).tqe_next) {
            *(byte *)&pCVar10->flags = (byte)pCVar10->flags & 0x3f;
          }
        }
        (*pCVar9->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_0056f805;
    }
    plVar24 = puVar2->hook[0].head;
    if (plVar24 == (list_item *)0x0) goto LAB_0056f759;
    bVar25 = false;
    do {
      pvVar3 = plVar24->data;
      if (pvVar3 == (void *)0x0) break;
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar25 = true;
      }
      plVar24 = plVar24->next;
    } while (plVar24 != (list_item *)0x0);
    if (!bVar25) goto LAB_0056f759;
    cpu->exception_index = -1;
  }
  pTVar21 = (TranslationBlock_conflict *)0x0;
  pTVar20 = pTVar21;
  while( true ) {
    pCVar23 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x1fea) = 0;
    uVar15 = cpu->interrupt_request;
    if (uVar15 != 0) {
      uVar14 = uVar15;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar14 = uVar15 & 0xffffeda5;
      }
      if ((char)uVar14 < '\0') {
        cpu->interrupt_request = uVar15 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_0056f0c2;
      }
      if ((uVar14 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_0056f0c2;
      }
      _Var11 = (*pCVar23->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar14);
      if (_Var11) {
        cpu->exception_index = -1;
        pTVar20 = (TranslationBlock_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar20 = (TranslationBlock_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    uVar15 = cpu->cflags_next_tb;
    if (uVar15 == 0xffffffff) {
      uVar15 = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar2 = cpu->uc;
    env = (CPUARMState *)cpu->env_ptr;
    cpu_get_tb_cpu_state_arm(env,(target_ulong *)&local_68,(target_ulong *)&local_64,&local_6c);
    bVar19 = (char)env->uc->init_target_page->bits - 6;
    uVar14 = local_68 >> (bVar19 & 0x1f) ^ local_68;
    uVar14 = uVar14 & 0x3f | uVar14 >> (bVar19 & 0x1f) & 0xfc0;
    pTVar18 = cpu->tb_jmp_cache[uVar14];
    cf_mask = cpu->cluster_index << 0x18 | uVar15 & 0xffffff;
    if ((((pTVar18 == (TranslationBlock *)0x0) || ((uint)pTVar18->pc != local_68)) ||
        (*(uint *)((long)&pTVar18->pc + 4) != local_64)) ||
       ((((uint32_t)pTVar18->cs_base != local_6c ||
         (uVar1._0_2_ = pTVar18->size, uVar1._2_2_ = pTVar18->icount,
         cpu->trace_dstate[0] != (ulong)uVar1)) || ((pTVar18->flags & 0xff0effff) != cf_mask)))) {
      pTVar18 = tb_htable_lookup_arm(cpu,(ulong)local_68,(ulong)local_64,local_6c,cf_mask);
      if (pTVar18 == (TranslationBlock *)0x0) {
        pTVar18 = (TranslationBlock *)tb_gen_code_arm(cpu,local_68,local_64,local_6c,uVar15);
        bVar19 = (char)cpu->uc->init_target_page->bits - 6;
        uVar15 = local_68 >> (bVar19 & 0x1f) ^ local_68;
        cpu->tb_jmp_cache[uVar15 & 0x3f | uVar15 >> (bVar19 & 0x1f) & 0xfc0] = pTVar18;
        pTVar4 = puVar2->last_tb;
        if (pTVar4 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar18->pc;
          auVar26 = ZEXT416(*(uint *)((long)&pTVar18->cs_base + 4));
          auVar26 = pshuflw(auVar26,auVar26,0xe1);
          local_38 = auVar26._0_4_;
          local_50 = (ulong)(uint)pTVar4->pc;
          auVar26 = ZEXT416(*(uint *)((long)&pTVar4->cs_base + 4));
          auVar26 = pshuflw(auVar26,auVar26,0xe1);
          local_48 = auVar26._0_4_;
          for (plVar24 = puVar2->hook[0xf].head;
              (plVar24 != (list_item *)0x0 && (pvVar3 = plVar24->data, pvVar3 != (void *)0x0));
              plVar24 = plVar24->next) {
            if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
               (uVar16 = (ulong)(uint)pTVar18->pc,
               *(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
               uVar16 <= *(ulong *)((long)pvVar3 + 0x20) &&
               *(ulong *)((long)pvVar3 + 0x18) <= uVar16)) {
              (**(code **)((long)pvVar3 + 0x28))
                        (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar14] = pTVar18;
      }
    }
    if ((pTVar20 != (TranslationBlock_conflict *)0x0) &&
       (pTVar18->page_addr[0] == 0xffffffffffffffff)) {
      if (1 < (uint)pTVar21) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar18->flags & 0x40000) == 0) {
        LOCK();
        bVar25 = pTVar20->jmp_dest[(long)pTVar21] == 0;
        if (bVar25) {
          pTVar20->jmp_dest[(long)pTVar21] = (uintptr_t)pTVar18;
        }
        UNLOCK();
        if (bVar25) {
          pvVar3 = (pTVar20->tc).ptr;
          *(uint32_t *)(pTVar20->jmp_target_arg[(long)pTVar21] + (long)pvVar3) =
               (pTVar18->cflags - ((int)pTVar20->jmp_target_arg[(long)pTVar21] + (int)pvVar3)) + -4;
          pTVar20->jmp_list_next[(long)pTVar21] = pTVar18->jmp_target_arg[1];
          pTVar18->jmp_target_arg[1] = (ulong)pTVar20 | (ulong)pTVar21;
        }
      }
    }
    if (cpu->exit_request == false) {
      pvVar3 = cpu->env_ptr;
      tb_exec_lock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
      uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x2e8) + 0x90))(pvVar3);
      if (cpu->uc->nested_level == 1) {
        tb_exec_unlock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
      }
      cpu->can_do_io = 1;
      pTVar22 = (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc);
      if ((uVar16 & 2) != 0) {
        if (*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x358) == 0) {
          uVar15 = *(uint *)(*(long *)((long)pvVar3 + 0x1128) + 0x578);
          if (((0x12 < uVar15) || ((0x771c0U >> (uVar15 & 0x1f) & 1) == 0)) &&
             (cpu->uc->quit_request == false)) {
            p_Var7 = cpu->cc->synchronize_from_tb;
            if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
              p_Var8 = cpu->cc->set_pc;
              if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_0056f857;
              (*p_Var8)((CPUState_conflict *)cpu,(ulong)pTVar22->pc);
            }
            else {
              (*p_Var7)((CPUState_conflict *)cpu,pTVar22);
            }
          }
        }
        cpu->tcg_exit_req = 0;
      }
      cpu->uc->last_tb = pTVar18;
      uVar15 = (uint)uVar16 & 3;
      pTVar21 = (TranslationBlock_conflict *)(ulong)uVar15;
      pTVar20 = pTVar22;
      if (uVar15 == 3) {
        pTVar20 = (TranslationBlock_conflict *)0x0;
        pTVar21 = (TranslationBlock_conflict *)0x3;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x3fd)) {
          lVar5 = cpu->icount_budget;
          lVar17 = 0xffff;
          if (lVar5 < 0xffff) {
            lVar17 = lVar5;
          }
          uVar15 = (uint)lVar17;
          *(short *)(cpu[1].tb_jmp_cache + 0x3fd) = (short)lVar17;
          cpu->icount_extra = lVar5 - (int)uVar15;
          pTVar20 = (TranslationBlock_conflict *)0x0;
          pTVar21 = (TranslationBlock_conflict *)0x3;
          if (0 < (int)uVar15 && lVar5 - (int)uVar15 == 0) {
            uVar14 = 0x7fff;
            if (uVar15 < 0x7fff) {
              uVar14 = uVar15;
            }
            pTVar18 = (TranslationBlock *)
                      tb_gen_code_arm(cpu,pTVar22->pc,pTVar22->cs_base,pTVar22->flags,
                                      uVar14 | 0x10000);
            (pTVar18->tc).size = (size_t)pTVar22;
            uVar6._0_4_ = pTVar18->cflags;
            uVar6._4_4_ = pTVar18->trace_vcpu_dstate;
            pvVar3 = cpu->env_ptr;
            tb_exec_lock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
            uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x2e8) + 0x90))
                               (pvVar3,uVar6);
            if (cpu->uc->nested_level == 1) {
              tb_exec_unlock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
            }
            cpu->can_do_io = 1;
            if ((uVar16 & 2) != 0) {
              if (*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x358) == 0) {
                uVar15 = *(uint *)(*(long *)((long)pvVar3 + 0x1128) + 0x578);
                if (((0x12 < uVar15) || ((0x771c0U >> (uVar15 & 0x1f) & 1) == 0)) &&
                   (cpu->uc->quit_request == false)) {
                  p_Var7 = cpu->cc->synchronize_from_tb;
                  if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                    p_Var8 = cpu->cc->set_pc;
                    if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_0056f857:
                      __assert_fail("cc->set_pc",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                    ,0x61,
                                    "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
                    }
                    (*p_Var8)((CPUState_conflict *)cpu,
                              (ulong)((TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc))->
                                     pc);
                  }
                  else {
                    (*p_Var7)((CPUState_conflict *)cpu,
                              (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc));
                  }
                }
              }
              cpu->tcg_exit_req = 0;
            }
            tb_phys_invalidate_arm
                      ((TCGContext_conflict *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)pTVar18,
                       0xffffffffffffffff);
            tcg_tb_remove_arm((TCGContext_conflict *)cpu->uc->tcg_ctx,pTVar18);
            pTVar20 = (TranslationBlock_conflict *)0x0;
            pTVar21 = (TranslationBlock_conflict *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_0056f0c2;
joined_r0x0056f77a:
  if ((plVar24 == (list_item *)0x0) || (pvVar3 = plVar24->data, pvVar3 == (void *)0x0))
  goto LAB_0056f7a4;
  if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
     (cVar12 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
     cVar12 != '\0')) goto LAB_0056f7af;
  plVar24 = plVar24->next;
  goto joined_r0x0056f77a;
LAB_0056f7a4:
  puVar2->invalid_error = 10;
  goto LAB_0056f7af;
LAB_0056f759:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
LAB_0056f7af:
  uVar15 = 0x10001;
  pCVar23 = local_60;
LAB_0056f805:
  local_58->cpu->tcg_exit_req = 0;
  (*pCVar23->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar15;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}